

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

void __thiscall
bssl::InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::Shrink
          (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this,
          size_t new_size)

{
  if (new_size <= this->size_) {
    std::_Destroy_n_aux<false>::
    __destroy_n<std::unique_ptr<bssl::DTLSWriteEpoch,bssl::internal::Deleter>*,unsigned_long>
              ((unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)
               (this->storage_ + new_size * 8),this->size_ - new_size);
    this->size_ = (PackedSize<2UL>)new_size;
    return;
  }
  abort();
}

Assistant:

void Shrink(size_t new_size) {
    BSSL_CHECK(new_size <= size_);
    std::destroy_n(data() + new_size, size_ - new_size);
    size_ = static_cast<PackedSize<N>>(new_size);
  }